

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O0

void __thiscall lsp::ArxmlStorage::ArxmlStorage(ArxmlStorage *this)

{
  type *ptVar1;
  type *ptVar2;
  ArxmlStorage *this_local;
  
  boost::multi_index::
  multi_index_container<lsp::ShortnameElement,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_fullPathIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::const_mem_fun<lsp::ShortnameElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&lsp::ShortnameElement::getFullPath>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_offsetIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::charOffset>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<lsp::ShortnameElement>_>
  ::multi_index_container(&this->shortnames_);
  ptVar1 = boost::multi_index::
           multi_index_container<lsp::ShortnameElement,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_fullPathIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::const_mem_fun<lsp::ShortnameElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&lsp::ShortnameElement::getFullPath>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_offsetIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::charOffset>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<lsp::ShortnameElement>_>
           ::get<lsp::tag_fullPathIndex>(&this->shortnames_);
  this->shortnamesFullPathIndex_ = ptVar1;
  ptVar2 = boost::multi_index::
           multi_index_container<lsp::ShortnameElement,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_fullPathIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::const_mem_fun<lsp::ShortnameElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&lsp::ShortnameElement::getFullPath>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_offsetIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::charOffset>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<lsp::ShortnameElement>_>
           ::get<lsp::tag_offsetIndex>(&this->shortnames_);
  this->shortnamesOffsetIndex_ = ptVar2;
  std::deque<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::deque
            (&this->references_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->newlineOffsets_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->URIs_);
  return;
}

Assistant:

lsp::ArxmlStorage::ArxmlStorage()
    : shortnames_(),
      shortnamesFullPathIndex_{shortnames_.get<tag_fullPathIndex>()},
      shortnamesOffsetIndex_{shortnames_.get<tag_offsetIndex>()}
    {}